

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int_helper.c
# Opt level: O3

void helper_divq_EAX_x86_64(CPUX86State *env,target_ulong t0)

{
  uint64_t a0;
  ulong uVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  target_ulong tVar5;
  bool bVar6;
  uintptr_t unaff_retaddr;
  
  if (t0 == 0) {
LAB_005136f3:
    raise_exception_ra_x86_64(env,0,unaff_retaddr);
  }
  uVar1 = env->regs[0];
  uVar4 = env->regs[2];
  if (uVar4 == 0) {
    uVar4 = uVar1 % t0;
    uVar1 = uVar1 / t0;
  }
  else {
    if (t0 <= uVar4) goto LAB_005136f3;
    iVar2 = 0x40;
    do {
      uVar3 = uVar4 << 1 | uVar1 >> 0x3f;
      bVar6 = (long)uVar4 < 0;
      tVar5 = 0;
      if (t0 <= uVar3 || bVar6) {
        tVar5 = t0;
      }
      uVar4 = uVar3 - tVar5;
      uVar1 = (ulong)(t0 <= uVar3 || bVar6) + uVar1 * 2;
      iVar2 = iVar2 + -1;
    } while (iVar2 != 0);
  }
  env->regs[0] = uVar1;
  env->regs[2] = uVar4;
  return;
}

Assistant:

void helper_divq_EAX(CPUX86State *env, target_ulong t0)
{
    uint64_t r0, r1;

    if (t0 == 0) {
        raise_exception_ra(env, EXCP00_DIVZ, GETPC());
    }
    r0 = env->regs[R_EAX];
    r1 = env->regs[R_EDX];
    if (div64(&r0, &r1, t0)) {
        raise_exception_ra(env, EXCP00_DIVZ, GETPC());
    }
    env->regs[R_EAX] = r0;
    env->regs[R_EDX] = r1;
}